

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::reallocateTo
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,size_type newCapacity)

{
  path *__result;
  move_iterator<std::filesystem::__cxx11::path_*> __last;
  
  __result = (path *)operator_new(newCapacity * 0x28);
  __last._M_current = this->data_ + this->len;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<std::filesystem::__cxx11::path*>,std::filesystem::__cxx11::path*>
            (this->data_,__last,__result);
  cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
  this->cap = newCapacity;
  this->data_ = __result;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }